

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
KickExemptIRCCommand::trigger
          (KickExemptIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Server *pSVar1;
  string_view name;
  undefined8 uVar2;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  long lVar6;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  string local_248;
  __sv_type local_228;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  size_t local_208;
  size_t sStack_200;
  string local_1f8;
  __sv_type local_1d8;
  char *local_1c8;
  char *pcStack_1c0;
  rep local_1b8;
  __sv_type local_1b0;
  rep local_1a0;
  __sv_type local_198;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  reference local_170;
  Server **server;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range1;
  undefined1 local_148 [8];
  string setter;
  uint exemptions;
  PlayerInfo *player;
  size_t local_108;
  char *local_100;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_e0 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_c8;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  char *local_b8;
  long local_b0;
  Channel *chan;
  char *local_a0;
  KickExemptIRCCommand *local_98;
  size_t local_90;
  undefined1 auStack_88 [8];
  string_view target_name;
  size_t local_68;
  char *local_60;
  undefined1 local_58 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  IRC_Bot *source_local;
  KickExemptIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (KickExemptIRCCommand *)nick._M_len;
  pcVar7 = channel._M_str;
  nick_local._M_str = (char *)channel._M_len;
  local_68 = parameters._M_len;
  local_60 = parameters._M_str;
  command_split.second._M_str = (char *)source;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&target_name._M_str," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_58,(jessilib *)&local_68,
             (basic_string_view<char,_std::char_traits<char>_> *)&target_name._M_str,
             (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len);
  auStack_88 = local_58;
  target_name._M_len = command_split.first._M_len;
  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_88);
  pcVar3 = command_split.second._M_str;
  if (bVar5) {
    local_98 = this_local;
    local_90 = nick_local._M_len;
    _chan = sv("Error: Too Few Parameters. Syntax: KickExempt <Player> [Reason]",0x3f);
    Jupiter::IRC::Client::sendNotice(pcVar3,local_98,local_90,chan,local_a0);
  }
  servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)nick_local._M_str;
  local_b8 = pcVar7;
  local_b0 = Jupiter::IRC::Client::getChannel(command_split.second._M_str,nick_local._M_str,pcVar7);
  if (local_b0 != 0) {
    RenX::getCore();
    Jupiter::IRC::Client::Channel::getType();
    RenX::Core::getServers((int)local_e0);
    local_c8 = local_e0;
    bVar5 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::empty(local_c8);
    pcVar4 = nick_local._M_str;
    pcVar3 = command_split.second._M_str;
    if (bVar5) {
      bVar8 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_108 = bVar8._M_len;
      local_100 = bVar8._M_str;
      Jupiter::IRC::Client::sendMessage(pcVar3,pcVar4,pcVar7,local_108,local_100);
    }
    else {
      setter.field_2._12_4_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_148,(basic_string_view<char,_std::char_traits<char>_> *)&this_local
                 ,(allocator<char> *)((long)&__range1 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 "@IRC");
      this_00 = local_c8;
      __end1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_c8);
      server = (Server **)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00)
      ;
      while (bVar5 = __gnu_cxx::
                     operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                               (&__end1,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                         *)&server), pcVar3 = command_split.second._M_str,
            ((bVar5 ^ 0xffU) & 1) != 0) {
        local_170 = __gnu_cxx::
                    __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                    ::operator*(&__end1);
        if (*local_170 != (Server *)0x0) {
          local_188 = auStack_88._0_4_;
          uStack_184 = auStack_88._4_4_;
          uStack_180 = (undefined4)target_name._M_len;
          uStack_17c = target_name._M_len._4_4_;
          lVar6 = RenX::Server::getPlayerByPartName(*local_170,auStack_88,target_name._M_len);
          uVar2 = RenX::exemptionDatabase;
          if (lVar6 != 0) {
            if (*(long *)(lVar6 + 0xe8) == 0) {
              pSVar1 = *local_170;
              local_1b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_148);
              local_1b8 = (rep)std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
              RenX::ExemptionDatabase::add
                        (uVar2,pSVar1,lVar6,local_1b0._M_len,local_1b0._M_str,local_1b8,0x46);
            }
            else {
              pSVar1 = *local_170;
              local_198 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_148);
              local_1a0 = (rep)std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
              RenX::ExemptionDatabase::add
                        (uVar2,pSVar1,lVar6,local_198._M_len,local_198._M_str,local_1a0,6);
            }
            setter.field_2._12_4_ = setter.field_2._12_4_ + 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
        ::operator++(&__end1);
      }
      if (setter.field_2._12_4_ == 0) {
        local_1c8 = nick_local._M_str;
        local_208 = (size_t)auStack_88;
        sStack_200 = target_name._M_len;
        name._M_str = (char *)target_name._M_len;
        name._M_len = (size_t)auStack_88;
        pcStack_1c0 = pcVar7;
        player_not_found_message_abi_cxx11_(&local_1f8,name);
        local_1d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f8);
        Jupiter::IRC::Client::sendMessage
                  (pcVar3,local_1c8,pcStack_1c0,local_1d8._M_len,local_1d8._M_str);
        std::__cxx11::string::~string((string *)&local_1f8);
      }
      else {
        channel_local._M_len._0_4_ = channel._M_str._0_4_;
        channel_local._M_len._4_4_ = channel._M_str._4_4_;
        local_218 = nick_local._M_str._0_4_;
        uStack_214 = nick_local._M_str._4_4_;
        uStack_210 = (undefined4)channel_local._M_len;
        uStack_20c = channel_local._M_len._4_4_;
        string_printf_abi_cxx11_(&local_248,"%u players added.",(ulong)(uint)setter.field_2._12_4_);
        local_228 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_248);
        Jupiter::IRC::Client::sendMessage
                  (pcVar3,CONCAT44(uStack_214,local_218),CONCAT44(uStack_20c,uStack_210),
                   local_228._M_len,local_228._M_str);
        std::__cxx11::string::~string((string *)&local_248);
      }
      std::__cxx11::string::~string((string *)local_148);
    }
    std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_e0);
  }
  return;
}

Assistant:

void KickExemptIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	std::string_view target_name = command_split.first;
	if (target_name.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: KickExempt <Player> [Reason]"sv);
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	RenX::PlayerInfo *player;
	unsigned int exemptions = 0;
	std::string setter{ nick };
	setter += "@IRC";
	for (const auto& server : servers) {
		if (server != nullptr) {
			player = server->getPlayerByPartName(target_name);
			if (player != nullptr) {
				if (player->steamid != 0LL) {
					RenX::exemptionDatabase->add(*server, *player, setter, std::chrono::seconds::zero(), RenX::ExemptionDatabase::Entry::FLAG_TYPE_BAN | RenX::ExemptionDatabase::Entry::FLAG_TYPE_KICK);
				}
				else {
					RenX::exemptionDatabase->add(*server, *player, setter, std::chrono::seconds::zero(), RenX::ExemptionDatabase::Entry::FLAG_TYPE_BAN | RenX::ExemptionDatabase::Entry::FLAG_TYPE_KICK | RenX::ExemptionDatabase::Entry::FLAG_USE_IP);
				}
				++exemptions;
			}
		}
	}
	if (exemptions == 0) {
		source->sendMessage(channel, player_not_found_message(target_name));
	}
	else {
		source->sendMessage(channel, string_printf("%u players added.", exemptions));
	}
}